

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x11fwd.c
# Opt level: O1

void x11_free_fake_auth(X11FakeAuth *auth)

{
  void *ptr;
  
  if (auth->data != (uchar *)0x0) {
    smemclr(auth->data,(long)auth->datalen);
  }
  safefree(auth->data);
  safefree(auth->protoname);
  safefree(auth->datastring);
  safefree(auth->xa1_firstblock);
  if (auth->xdmseen != (tree234 *)0x0) {
    while( true ) {
      ptr = delpos234(auth->xdmseen,0);
      if (ptr == (void *)0x0) break;
      safefree(ptr);
    }
    freetree234(auth->xdmseen);
  }
  safefree(auth);
  return;
}

Assistant:

void x11_free_fake_auth(struct X11FakeAuth *auth)
{
    if (auth->data)
        smemclr(auth->data, auth->datalen);
    sfree(auth->data);
    sfree(auth->protoname);
    sfree(auth->datastring);
    sfree(auth->xa1_firstblock);
    if (auth->xdmseen != NULL) {
        struct XDMSeen *seen;
        while ((seen = delpos234(auth->xdmseen, 0)) != NULL)
            sfree(seen);
        freetree234(auth->xdmseen);
    }
    sfree(auth);
}